

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestSub.c
# Opt level: O3

void sbfRequestSub_destroy(sbfRequestSub sub)

{
  sbfLog_log(sub->mLog,0,"destroying request subscription %p",sub);
  if (sub->mPub != (sbfPub)0x0) {
    sbfPub_destroy();
  }
  if (sub->mSub != (sbfSub)0x0) {
    sbfSub_destroy();
  }
  free(sub->mTopic);
  free(sub);
  return;
}

Assistant:

void
sbfRequestSub_destroy (sbfRequestSub sub)
{
    sbfLog_debug (sub->mLog, "destroying request subscription %p", sub);

    if (sub->mPub != NULL)
        sbfPub_destroy (sub->mPub);
    if (sub->mSub != NULL)
        sbfSub_destroy (sub->mSub);

    free ((void*)sub->mTopic);
    free (sub);
}